

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O2

int cram_huffman_encode_store(cram_codec *c,cram_block *b,char *prefix,int version)

{
  uint uVar1;
  cram_huffman_code *pcVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  byte *__src;
  size_t __n;
  uchar *puVar6;
  ulong uVar7;
  byte bVar8;
  uint uVar9;
  byte bVar10;
  byte *pbVar11;
  size_t sVar12;
  size_t __size;
  byte bVar13;
  long lVar15;
  long lVar16;
  byte bVar17;
  int32_t *piVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  long lStack_40;
  byte bVar14;
  
  pcVar2 = (c->field_6).e_huffman.codes;
  uVar5 = (ulong)(c->field_6).e_huffman.nvals;
  __src = (byte *)malloc(uVar5 * 6 + 0x10);
  if (__src == (byte *)0x0) {
    iVar3 = -1;
  }
  else {
    if (prefix == (char *)0x0) {
      __n = 0;
    }
    else {
      __n = strlen(prefix);
      while( true ) {
        uVar5 = b->alloc;
        if (b->byte + __n < uVar5) break;
        auVar19._8_4_ = (int)(uVar5 >> 0x20);
        auVar19._0_8_ = uVar5;
        auVar19._12_4_ = 0x45300000;
        dVar21 = ((auVar19._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)) * 1.5;
        uVar7 = (ulong)dVar21;
        sVar12 = (long)(dVar21 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7;
        if (uVar5 == 0) {
          sVar12 = 0x400;
        }
        b->alloc = sVar12;
        puVar6 = (uchar *)realloc(b->data,sVar12);
        b->data = puVar6;
      }
      memcpy(b->data + b->byte,prefix,__n);
      b->byte = b->byte + __n;
      uVar5 = (ulong)(uint)(c->field_6).e_huffman.nvals;
    }
    uVar9 = (uint)uVar5;
    bVar8 = (byte)uVar5;
    bVar10 = (byte)(uVar5 >> 8);
    bVar13 = (byte)(uVar5 >> 0x18);
    bVar14 = (byte)(uVar5 >> 0x10);
    if (uVar9 < 0x80) {
      *__src = bVar8;
      lVar15 = 1;
    }
    else if (uVar9 < 0x4000) {
      *__src = bVar10 | 0x80;
      __src[1] = bVar8;
      lVar15 = 2;
    }
    else if (uVar9 < 0x200000) {
      *__src = bVar14 | 0xc0;
      __src[1] = bVar10;
      __src[2] = bVar8;
      lVar15 = 3;
    }
    else if (uVar9 < 0x10000000) {
      *__src = bVar13 | 0xe0;
      __src[1] = bVar14;
      __src[2] = bVar10;
      __src[3] = bVar8;
      lVar15 = 4;
    }
    else {
      *__src = bVar13 >> 4 | 0xf0;
      __src[1] = (byte)(uVar5 >> 0x14);
      __src[2] = (byte)(uVar5 >> 0xc);
      __src[3] = (byte)(uVar5 >> 4);
      __src[4] = bVar8 & 0xf;
      lVar15 = 5;
    }
    pbVar11 = __src + lVar15;
    lVar15 = 0;
    uVar7 = 0;
    if (0 < (int)uVar9) {
      uVar7 = uVar5 & 0xffffffff;
    }
    for (; uVar7 * 0x10 != lVar15; lVar15 = lVar15 + 0x10) {
      uVar1 = *(uint *)((long)&pcVar2->symbol + lVar15);
      if (uVar1 < 0x80) {
        *pbVar11 = (byte)uVar1;
        lVar16 = 1;
      }
      else if (uVar1 < 0x4000) {
        *pbVar11 = (byte)(uVar1 >> 8) | 0x80;
        pbVar11[1] = *(byte *)((long)&pcVar2->symbol + lVar15);
        lVar16 = 2;
      }
      else if (uVar1 < 0x200000) {
        *pbVar11 = (byte)(uVar1 >> 0x10) | 0xc0;
        pbVar11[1] = *(byte *)((long)&pcVar2->symbol + lVar15 + 1);
        pbVar11[2] = *(byte *)((long)&pcVar2->symbol + lVar15);
        lVar16 = 3;
      }
      else {
        bVar17 = (byte)(uVar1 >> 0x18);
        if (uVar1 < 0x10000000) {
          *pbVar11 = bVar17 | 0xe0;
          pbVar11[1] = *(byte *)((long)&pcVar2->symbol + lVar15 + 2);
          pbVar11[2] = *(byte *)((long)&pcVar2->symbol + lVar15 + 1);
          pbVar11[3] = *(byte *)((long)&pcVar2->symbol + lVar15);
          lVar16 = 4;
        }
        else {
          *pbVar11 = bVar17 >> 4 | 0xf0;
          pbVar11[1] = (byte)(*(uint *)((long)&pcVar2->symbol + lVar15) >> 0x14);
          pbVar11[2] = (byte)(*(uint *)((long)&pcVar2->symbol + lVar15) >> 0xc);
          pbVar11[3] = (byte)(*(uint *)((long)&pcVar2->symbol + lVar15) >> 4);
          pbVar11[4] = *(byte *)((long)&pcVar2->symbol + lVar15) & 0xf;
          lVar16 = 5;
        }
      }
      pbVar11 = pbVar11 + lVar16;
    }
    if (uVar9 < 0x80) {
      *pbVar11 = bVar8;
      lStack_40 = 1;
    }
    else if (uVar9 < 0x4000) {
      *pbVar11 = bVar10 | 0x80;
      pbVar11[1] = bVar8;
      lStack_40 = 2;
    }
    else if (uVar9 < 0x200000) {
      *pbVar11 = bVar14 | 0xc0;
      pbVar11[1] = bVar10;
      pbVar11[2] = bVar8;
      lStack_40 = 3;
    }
    else if (uVar9 < 0x10000000) {
      *pbVar11 = bVar13 | 0xe0;
      pbVar11[1] = bVar14;
      pbVar11[2] = bVar10;
      pbVar11[3] = bVar8;
      lStack_40 = 4;
    }
    else {
      *pbVar11 = bVar13 >> 4 | 0xf0;
      pbVar11[1] = (byte)(uVar5 >> 0x14);
      pbVar11[2] = (byte)(uVar5 >> 0xc);
      pbVar11[3] = (byte)(uVar5 >> 4);
      pbVar11[4] = bVar8 & 0xf;
      lStack_40 = 5;
    }
    pbVar11 = pbVar11 + lStack_40;
    piVar18 = &pcVar2->len;
    for (lVar15 = 0; lVar15 < (int)uVar5; lVar15 = lVar15 + 1) {
      uVar9 = *piVar18;
      if (uVar9 < 0x80) {
        *pbVar11 = (byte)uVar9;
        lVar16 = 1;
      }
      else if (uVar9 < 0x4000) {
        *pbVar11 = (byte)(uVar9 >> 8) | 0x80;
        pbVar11[1] = (byte)*piVar18;
        lVar16 = 2;
      }
      else if (uVar9 < 0x200000) {
        *pbVar11 = (byte)(uVar9 >> 0x10) | 0xc0;
        pbVar11[1] = *(byte *)((long)piVar18 + 1);
        pbVar11[2] = (byte)*piVar18;
        lVar16 = 3;
      }
      else {
        bVar8 = (byte)(uVar9 >> 0x18);
        if (uVar9 < 0x10000000) {
          *pbVar11 = bVar8 | 0xe0;
          pbVar11[1] = *(byte *)((long)piVar18 + 2);
          pbVar11[2] = *(byte *)((long)piVar18 + 1);
          pbVar11[3] = (byte)*piVar18;
          lVar16 = 4;
        }
        else {
          *pbVar11 = bVar8 >> 4 | 0xf0;
          pbVar11[1] = (byte)((uint)*piVar18 >> 0x14);
          pbVar11[2] = (byte)((uint)*piVar18 >> 0xc);
          pbVar11[3] = (byte)((uint)*piVar18 >> 4);
          pbVar11[4] = (byte)*piVar18 & 0xf;
          lVar16 = 5;
        }
      }
      pbVar11 = pbVar11 + lVar16;
      uVar5 = (ulong)(uint)(c->field_6).e_huffman.nvals;
      piVar18 = piVar18 + 4;
    }
    iVar3 = itf8_put_blk(b,c->codec);
    sVar12 = (long)pbVar11 - (long)__src;
    iVar4 = itf8_put_blk(b,(int)sVar12);
    while( true ) {
      uVar5 = b->alloc;
      if (b->byte + sVar12 < uVar5) break;
      auVar20._8_4_ = (int)(uVar5 >> 0x20);
      auVar20._0_8_ = uVar5;
      auVar20._12_4_ = 0x45300000;
      dVar21 = ((auVar20._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)) * 1.5;
      uVar7 = (ulong)dVar21;
      __size = (long)(dVar21 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7;
      if (uVar5 == 0) {
        __size = 0x400;
      }
      b->alloc = __size;
      puVar6 = (uchar *)realloc(b->data,__size);
      b->data = puVar6;
    }
    memcpy(b->data + b->byte,__src,sVar12);
    b->byte = b->byte + sVar12;
    iVar3 = iVar3 + iVar4 + (int)__n + (int)sVar12;
    free(__src);
  }
  return iVar3;
}

Assistant:

int cram_huffman_encode_store(cram_codec *c, cram_block *b, char *prefix,
			      int version) {
    int i, len = 0;
    cram_huffman_code *codes = c->e_huffman.codes;
    /*
     * Up to code length 127 means 2.5e+26 bytes of data required (worst
     * case huffman tree needs symbols with freqs matching the Fibonacci
     * series). So guaranteed 1 byte per code.
     *
     * Symbols themselves could be 5 bytes (eg -1 is 5 bytes in itf8).
     *
     * Therefore 6*ncodes + 5 + 5 + 1 + 5 is max memory
     */
    char *tmp = malloc(6*c->e_huffman.nvals+16);
    char *tp = tmp;

    if (!tmp)
	return -1;

    if (prefix) {
	size_t l = strlen(prefix);
	BLOCK_APPEND(b, prefix, l);
	len += l;
    }

    tp += itf8_put(tp, c->e_huffman.nvals);
    for (i = 0; i < c->e_huffman.nvals; i++) {
	tp += itf8_put(tp, codes[i].symbol);
    }

    tp += itf8_put(tp, c->e_huffman.nvals);
    for (i = 0; i < c->e_huffman.nvals; i++) {
	tp += itf8_put(tp, codes[i].len);
    }

    len += itf8_put_blk(b, c->codec);
    len += itf8_put_blk(b, tp-tmp);
    BLOCK_APPEND(b, tmp, tp-tmp);
    len += tp-tmp;

    free(tmp);

    return len;
}